

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

iterator __thiscall
GF2::MI<45ul,GF2::MOGrlex<45ul>>::Insert<45ul,GF2::MOGrlex<45ul>>
          (MI<45ul,GF2::MOGrlex<45ul>> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *polyRight)

{
  bool bVar1;
  iterator pos;
  iterator local_38;
  _List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> local_30;
  
  local_38._M_node = (_List_node_base *)0x0;
  bVar1 = MI<45UL,_GF2::MOGrlex<45UL>_>::Find
                    ((MI<45UL,_GF2::MOGrlex<45UL>_> *)this,polyRight,&local_38);
  if (!bVar1) {
    local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
    local_30._M_impl._M_node._M_size = 0;
    local_30._M_impl._M_node.super__List_node_base._M_prev =
         local_30._M_impl._M_node.super__List_node_base._M_next;
    local_38 = std::__cxx11::
               list<GF2::MP<45ul,GF2::MOGrlex<45ul>>,std::allocator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>>
               ::emplace<GF2::MP<45ul,GF2::MOGrlex<45ul>>>
                         ((list<GF2::MP<45ul,GF2::MOGrlex<45ul>>,std::allocator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>>
                           *)this,local_38._M_node,
                          (MP<45UL,_GF2::MOGrlex<45UL>_> *)
                          local_30._M_impl._M_node.super__List_node_base._M_next);
    MP<45UL,_GF2::MOGrlex<45UL>_>::operator=
              ((MP<45UL,_GF2::MOGrlex<45UL>_> *)(local_38._M_node + 1),polyRight);
    std::__cxx11::_List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::_M_clear(&local_30);
  }
  return (iterator)local_38._M_node;
}

Assistant:

iterator Insert(const MP<_m, _O1>& polyRight)
	{	
		assert(!polyRight.IsEmpty());
		iterator pos;
		if (!Find(polyRight, pos))
			*(pos = insert(pos, MP<_n, _O>(_order))) = polyRight;
		return pos;
	}